

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_mgga_inc.c
# Opt level: O2

void work_mgga_exc_unpol(xc_func_type *p,size_t np,double *rho,double *sigma,double *lapl,
                        double *tau,xc_mgga_out_params *out)

{
  uint uVar1;
  double *pdVar2;
  double *pdVar3;
  bool bVar4;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  undefined1 auVar37 [16];
  undefined8 uVar39;
  undefined1 auVar38 [16];
  double dVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  double dVar43;
  double dVar44;
  double local_160;
  double local_158;
  double local_148;
  double local_138;
  
  local_160 = 0.0;
  for (sVar6 = 0; np != sVar6; sVar6 = sVar6 + 1) {
    lVar5 = (long)(p->dim).rho * sVar6;
    dVar8 = rho[lVar5];
    if (p->nspin == 2) {
      dVar8 = dVar8 + rho[lVar5 + 1];
    }
    dVar17 = p->dens_threshold;
    if (dVar17 <= dVar8) {
      dVar8 = rho[lVar5];
      if (rho[lVar5] <= dVar17) {
        dVar8 = dVar17;
      }
      dVar9 = p->sigma_threshold * p->sigma_threshold;
      local_158 = sigma[(long)(p->dim).sigma * sVar6];
      if (sigma[(long)(p->dim).sigma * sVar6] <= dVar9) {
        local_158 = dVar9;
      }
      uVar1 = p->info->flags;
      if ((uVar1 >> 0x10 & 1) != 0) {
        local_160 = tau[(long)(p->dim).tau * sVar6];
        if (tau[(long)(p->dim).tau * sVar6] <= p->tau_threshold) {
          local_160 = p->tau_threshold;
        }
        if (((uVar1 >> 0x11 & 1) != 0) && (dVar9 = dVar8 * 8.0 * local_160, dVar9 <= local_158)) {
          local_158 = dVar9;
        }
      }
      pdVar2 = (double *)p->params;
      dVar9 = p->zeta_threshold;
      dVar10 = cbrt(0.3183098861837907);
      dVar11 = dVar10 * 1.4422495703074083 * 2.519842099789747;
      dVar12 = cbrt(dVar9);
      dVar23 = dVar9 * dVar12;
      local_138 = dVar23;
      if (dVar9 < 2.0) {
        local_138 = 2.5198420997897464;
      }
      dVar13 = cbrt(dVar8);
      dVar14 = cbrt(9.0);
      dVar30 = 1.0 / dVar13;
      dVar14 = (dVar14 * dVar14 * dVar10 * dVar10 * p->cam_omega * 1.4422495703074083 * dVar30 *
               (double)(~-(ulong)(2.0 <= dVar9) & 0x3ff0000000000000 |
                       (ulong)(1.2599210498948732 / dVar12) & -(ulong)(2.0 <= dVar9))) / 18.0;
      dVar18 = 1.35;
      if (dVar14 <= 1.35) {
        dVar18 = dVar14;
      }
      dVar15 = erf((1.0 / dVar18) * 0.5);
      dVar16 = exp((-1.0 / (dVar18 * dVar18)) * 0.25);
      if (1.35 <= dVar14) {
        if (dVar14 <= 1.35) {
          dVar14 = 1.35;
        }
        dVar14 = dVar14 * dVar14;
        dVar18 = dVar14 * dVar14;
        dVar15 = dVar18 * dVar18;
        auVar29._8_8_ = dVar18;
        auVar29._0_8_ = dVar14;
        auVar41 = divpd(_DAT_010020a0,auVar29);
        auVar42 = divpd(auVar41,_DAT_01010a50);
        auVar37._8_8_ = dVar15;
        auVar37._0_8_ = dVar14 * dVar18;
        auVar37 = divpd(_DAT_010020a0,auVar37);
        uVar39 = auVar37._8_8_;
        auVar22._8_8_ = 0x3ff0000000000000;
        auVar22._0_8_ = uVar39;
        auVar41._8_8_ = dVar15 * dVar15;
        auVar41._0_8_ = dVar14 * dVar18;
        auVar41 = divpd(auVar22,auVar41);
        auVar28._8_8_ = uVar39;
        auVar28._0_8_ = uVar39;
        auVar38._8_8_ = dVar18;
        auVar38._0_8_ = dVar14;
        auVar29 = divpd(auVar28,auVar38);
        auVar38 = divpd(auVar37,_DAT_01010a60);
        auVar29 = divpd(auVar29,_DAT_01010a70);
        auVar41 = divpd(auVar41,_DAT_01010a80);
        local_148 = ((((((auVar42._0_8_ - auVar42._8_8_) + auVar38._0_8_) - auVar38._8_8_) +
                      auVar29._0_8_) - auVar29._8_8_) + auVar41._0_8_) - auVar41._8_8_;
      }
      else {
        local_148 = dVar18 * -2.6666666666666665 *
                    (dVar15 * 1.7724538509055159 +
                    (dVar16 + -1.5 + (dVar16 + -1.0) * dVar18 * dVar18 * -2.0) * (dVar18 + dVar18))
                    + 1.0;
      }
      bVar4 = dVar17 < dVar8 * 0.5;
      dVar15 = dVar8 * dVar8;
      dVar31 = 1.0 / (dVar13 * dVar13);
      dVar16 = local_158 * 1.5874010519681996 * (dVar31 / dVar15);
      dVar32 = (dVar31 / dVar15) * 1.5874010519681996;
      dVar17 = cbrt(9.869604401089358);
      dVar17 = dVar17 * dVar17 * 3.3019272488946267;
      dVar43 = dVar17 * 0.3;
      dVar24 = (dVar31 / dVar8) * local_160 * 1.5874010519681996;
      dVar14 = dVar24 + dVar43;
      dVar43 = dVar43 - dVar24;
      dVar18 = 0.0;
      if (bVar4 && dVar9 < 1.0) {
        dVar18 = dVar11 * 1.2599210498948732 * -0.046875 * dVar13 * local_138 *
                 local_148 *
                 (pdVar2[2] * dVar43 * (1.0 / dVar14) +
                 (1.0 / (dVar16 * 0.003840616724010807 + 1.0)) *
                 pdVar2[1] * local_158 * 0.003840616724010807 * dVar32 + *pdVar2);
        dVar18 = dVar18 + dVar18;
      }
      dVar13 = 1.0;
      if (1.0 <= dVar9) {
        dVar13 = p->zeta_threshold;
      }
      uVar7 = -(ulong)(1.0 <= dVar9);
      dVar12 = (double)((ulong)(1.0 / dVar12) & uVar7 | ~uVar7 & 0x3ff0000000000000);
      dVar11 = dVar11 * dVar30;
      dVar40 = dVar11 * 1.2599210498948732 * dVar12;
      dVar25 = SQRT(dVar40);
      dVar19 = dVar25;
      if (dVar40 < 0.0) {
        dVar19 = sqrt(dVar40);
        dVar25 = sqrt(dVar40);
      }
      dVar25 = dVar25 * dVar40;
      dVar31 = dVar10 * dVar10 * 2.080083823051904 * 1.5874010519681996 * dVar31;
      dVar26 = dVar31 * 1.5874010519681996 * dVar12 * dVar12;
      dVar12 = log(16.081979498692537 /
                   (dVar26 * 0.123235 + dVar25 * 0.204775 + dVar19 * 3.79785 + dVar40 * 0.8969) +
                   1.0);
      dVar10 = p->zeta_threshold;
      dVar20 = log(32.16395899738507 /
                   (dVar26 * 0.1562925 + dVar25 * 0.420775 + dVar19 * 7.05945 + dVar40 * 1.549425) +
                   1.0);
      dVar19 = log(29.608749977793437 /
                   (dVar26 * 0.1241775 + dVar25 * 0.1100325 + dVar19 * 5.1785 + dVar40 * 0.905775) +
                   1.0);
      dVar25 = 0.0;
      if (bVar4 && dVar9 < 1.0) {
        dVar19 = (dVar40 * 0.0278125 + 1.0) * dVar19;
        dVar12 = (dVar40 * 0.053425 + 1.0) * 0.0621814 * dVar12;
        dVar9 = (local_138 + (double)(-(ulong)(0.0 <= dVar10) & (ulong)dVar23) + -2.0) *
                1.9236610509315362;
        dVar25 = dVar13 * (dVar9 * 0.0197516734986138 * dVar19 +
                          ((dVar19 * -0.0197516734986138 +
                           (dVar40 * 0.05137 + 1.0) * -0.0310907 * dVar20 + dVar12) * dVar9 - dVar12
                          )) * 0.5;
      }
      dVar9 = pdVar2[3];
      dVar10 = pdVar2[4];
      dVar27 = dVar43 * dVar43;
      dVar12 = pdVar2[5];
      dVar20 = local_158 * local_158;
      dVar20 = dVar20 * dVar20 * dVar20;
      dVar13 = pdVar2[6];
      dVar19 = pdVar2[7];
      dVar26 = SQRT(dVar11);
      dVar40 = dVar26;
      if (dVar11 < 0.0) {
        dVar40 = sqrt(dVar11);
      }
      if (dVar11 < 0.0) {
        dVar26 = sqrt(dVar11);
      }
      dVar21 = log(16.081979498692537 /
                   (dVar31 * 0.123235 +
                   dVar26 * dVar11 * 0.204775 + dVar40 * 3.79785 + dVar11 * 0.8969) + 1.0);
      dVar34 = (double)(~uVar7 & 0x3ff0000000000000 | uVar7 & (ulong)dVar23);
      dVar31 = log(29.608749977793437 /
                   (dVar31 * 0.1241775 +
                   dVar26 * dVar11 * 0.1100325 + dVar40 * 5.1785 + dVar11 * 0.905775) + 1.0);
      dVar24 = dVar24 * dVar17 * 0.6;
      dVar35 = local_160 * local_160 * 1.2599210498948732 * 4.0 * (dVar30 / (dVar8 * dVar15));
      dVar26 = dVar24 - dVar35;
      dVar26 = dVar26 * dVar26;
      dVar8 = pdVar2[9];
      dVar30 = dVar26 * dVar26 * dVar26;
      dVar17 = pdVar2[10];
      dVar23 = pdVar2[0xb];
      dVar40 = cbrt(dVar16);
      pdVar3 = out->zk;
      if ((pdVar3 != (double *)0x0) && ((p->info->flags & 1) != 0)) {
        dVar33 = dVar14 * dVar14;
        dVar44 = dVar16 * 0.46914023462026644 + 1.0;
        dVar16 = dVar44 * dVar44;
        dVar15 = dVar15 * dVar15 * dVar15 * dVar15;
        dVar36 = 1.0 / (dVar15 * dVar15);
        dVar16 = (1.0 / (dVar16 * dVar16)) / dVar16;
        dVar35 = dVar35 + dVar24;
        dVar35 = dVar35 * dVar35;
        dVar15 = (1.0 / (dVar35 * dVar35)) / dVar35;
        lVar5 = (long)(p->dim).zk * sVar6;
        pdVar3[lVar5] =
             (dVar8 * dVar26 * (1.0 / dVar35) + dVar15 * dVar17 * dVar30 +
              dVar30 * dVar23 * dVar15 * dVar40 + dVar40 * (1.0 / dVar35) * dVar26 * pdVar2[0xc] +
             pdVar2[8]) *
             (((dVar11 * 0.053425 + 1.0) * -0.0621814 * dVar21 +
              (dVar11 * 0.0278125 + 1.0) *
              (dVar34 + dVar34 + -2.0) * 1.9236610509315362 * 0.0197516734986138 * dVar31) -
             (dVar25 + dVar25)) +
             dVar18 + (dVar20 * (1.0 / (dVar33 * dVar33)) * dVar27 * dVar27 * dVar19 *
                                0.17058312527037534 * dVar36 * dVar16 +
                      dVar13 * dVar20 * 0.17058312527037534 * dVar36 * dVar16 +
                      (1.0 / dVar14) * dVar10 * dVar43 +
                      dVar32 * dVar9 * local_158 * 0.46914023462026644 * (1.0 / dVar44) +
                      dVar12 * dVar27 * (1.0 / dVar33)) * (dVar25 + dVar25) + pdVar3[lVar5];
      }
    }
  }
  return;
}

Assistant:

static void
WORK_MGGA(ORDER_TXT, SPIN_TXT)
(const XC(func_type) *p, size_t np,
 const double *rho, const double *sigma, const double *lapl, const double *tau,
 xc_mgga_out_params *out)
{

#ifdef XC_DEBUG
  /* This throws an exception when floating point errors are encountered */
  //feenableexcept(FE_DIVBYZERO | FE_INVALID | FE_OVERFLOW);
#endif

  size_t ip;
  double dens;
  double my_rho[2]={0.0, 0.0};
  double my_sigma[3]={0.0, 0.0, 0.0};
  double my_tau[2]={0.0, 0.0};

  for(ip = 0; ip < np; ip++){
    /* Screen low density */
    dens = (p->nspin == XC_POLARIZED) ? VAR(rho, ip, 0) + VAR(rho, ip, 1) : VAR(rho, ip, 0);
    if(dens < p->dens_threshold)
      continue;

    /* sanity check of input parameters */
    my_rho[0] = m_max(p->dens_threshold, VAR(rho, ip, 0));
    my_sigma[0] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 0));

    /* Many functionals shamelessly divide by tau, so we set a reasonable threshold */
    /* skip all checks on tau for the kinetic functionals */
    if(p->info->flags & XC_FLAGS_NEEDS_TAU){
      my_tau[0] = m_max(p->tau_threshold, VAR(tau, ip, 0));
      if(p->info->flags & XC_FLAGS_ENFORCE_FHC) {
        /* The Fermi hole curvature 1 - xs^2/(8*ts) must be positive */
        my_sigma[0] = m_min(my_sigma[0], 8.0*my_rho[0]*my_tau[0]);
      }
    }
    /* lapl can have any values */

    if(p->nspin == XC_POLARIZED){
      double s_ave;

      my_rho[1] = m_max(p->dens_threshold, VAR(rho, ip, 1));
      my_sigma[2] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 2));

      if(p->info->flags & XC_FLAGS_NEEDS_TAU){
        my_tau[1] = m_max(p->tau_threshold, VAR(tau, ip, 1));
        if(p->info->flags & XC_FLAGS_ENFORCE_FHC) {
          /* The Fermi hole curvature 1 - xs^2/(8*ts) must be positive */
          my_sigma[2] = m_min(my_sigma[2], 8.0*my_rho[1]*my_tau[1]);
        }
      }
      
      my_sigma[1] = VAR(sigma, ip, 1);
      s_ave = 0.5*(my_sigma[0] + my_sigma[2]);
      /* | grad n |^2 = |grad n_up + grad n_down|^2 > 0 */
      my_sigma[1] = (my_sigma[1] >= -s_ave ? my_sigma[1] : -s_ave);
      /* Since |grad n_up - grad n_down|^2 > 0 we also have */
      my_sigma[1] = (my_sigma[1] <= +s_ave ? my_sigma[1] : +s_ave);
    }

    FUNC(ORDER_TXT, SPIN_TXT)(p, ip, my_rho, my_sigma, &VAR(lapl, ip, 0), my_tau, out);

    /* check for NaNs */
#ifdef XC_DEBUG
    {
      const xc_dimensions *dim = &(p->dim);
      int ii, is_OK = 1;

      if(out->zk != NULL)
        is_OK = is_OK & isfinite(out->VAR(zk, ip, 0));

      if(out->vrho != NULL){
        for(ii=0; ii < dim->vrho; ii++)
          is_OK = is_OK && isfinite(out->VAR(vrho, ip, ii));
        for(ii=0; ii < dim->vsigma; ii++)
          is_OK = is_OK && isfinite(out->VAR(vsigma, ip, ii));
        if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
          for(ii=0; ii < dim->vlapl; ii++)
            is_OK = is_OK && isfinite(out->VAR(vlapl, ip, ii));
        if(p->info->flags & XC_FLAGS_NEEDS_TAU)
          for(ii=0; ii < dim->vtau; ii++)
            is_OK = is_OK && isfinite(out->VAR(vtau, ip, ii));
      }

      if(!is_OK){
        printf("Problem in the evaluation of the functional\n");
        if(p->nspin == XC_UNPOLARIZED){
          printf("./xc-get_data %d 1 ", p->info->number);
          if(p->info->flags & (XC_FLAGS_NEEDS_LAPLACIAN | XC_FLAGS_NEEDS_TAU))
            printf("%le 0.0 %le 0.0 0.0 %le 0.0 %le 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(lapl, ip, 0), VAR(tau, ip, 0));
          else if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
            printf("%le 0.0 %le 0.0 0.0 %le 0.0 0.0 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(lapl, ip, 0));
          else
            printf("%le 0.0 %le 0.0 0.0 0.0 0.0 %le 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(tau, ip, 0));
        }else{
          printf("./xc-get_data %d 2 ", p->info->number);
          if(p->info->flags & (XC_FLAGS_NEEDS_LAPLACIAN | XC_FLAGS_NEEDS_TAU))
            printf("%le %le %le %le %le %le %le %le %le\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(lapl, ip, 0), VAR(lapl, ip, 1),
                   VAR(tau, ip, 0), VAR(tau, ip, 1));
          else if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
            printf("%le %le %le %le %le %le %le 0.0 0.0\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(lapl, ip, 0), VAR(lapl, ip, 1));
          else
            printf("%le %le %le %le %le 0.0 0.0 %le %le\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(tau, ip, 0), VAR(tau, ip, 1));
        }
      }
    }
#endif
  }   /* for(ip) */

}